

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O0

void __thiscall
pzgeom::TPZTriangleTorus::GradX<double>
          (TPZTriangleTorus *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double *pdVar1;
  TPZMatrix<double> *this_00;
  double *pdVar2;
  TPZFMatrix<double> *this_01;
  double dVar3;
  double dVar4;
  TPZFMatrix<double> *B;
  _func_int **row;
  TPZManVector<double,_3> *this_02;
  TPZManVector<double,_3> ft;
  TPZFNMatrix<6,_double> gradphi;
  TPZFNMatrix<6,_double> DxDphi;
  int64_t in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  TPZFNMatrix<6,_double> *in_stack_fffffffffffffd50;
  double *in_stack_fffffffffffffd58;
  TPZManVector<double,_3> *in_stack_fffffffffffffd60;
  int64_t in_stack_fffffffffffffd68;
  TPZFNMatrix<6,_double> *in_stack_fffffffffffffd70;
  int opt;
  TPZVec<double> local_200 [7];
  TPZVec<double> *in_stack_fffffffffffffee0;
  TPZVec<double> *in_stack_fffffffffffffee8;
  TPZFMatrix<double> *in_stack_fffffffffffffef0;
  TPZFMatrix<double> *pTVar5;
  TPZVec<double> *in_stack_ffffffffffffff18;
  TPZFMatrix<double> *in_stack_ffffffffffffff20;
  
  pTVar5 = (TPZFMatrix<double> *)0x0;
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int64_t)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
             (double *)in_stack_fffffffffffffd50);
  TPZGeoTriangle::X<double>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  TPZGeoTriangle::GradX<double>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,pTVar5);
  pdVar1 = TPZVec<double>::operator[](local_200,1);
  dVar3 = cos(*pdVar1);
  pdVar1 = TPZVec<double>::operator[](local_200,0);
  dVar4 = sin(*pdVar1);
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffd50->super_TPZFMatrix<double>,in_stack_fffffffffffffd48
                      ,in_stack_fffffffffffffd40);
  *pdVar1 = -dVar3 * dVar4;
  pdVar1 = TPZVec<double>::operator[](local_200,0);
  dVar3 = cos(*pdVar1);
  pdVar1 = TPZVec<double>::operator[](local_200,1);
  dVar4 = sin(*pdVar1);
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffd50->super_TPZFMatrix<double>,in_stack_fffffffffffffd48
                      ,in_stack_fffffffffffffd40);
  *pdVar1 = -(dVar3 + 3.0) * dVar4;
  this_00 = (TPZMatrix<double> *)TPZVec<double>::operator[](local_200,1);
  dVar3 = sin((double)(this_00->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable);
  B = (TPZFMatrix<double> *)((ulong)dVar3 ^ 0x8000000000000000);
  pTVar5 = (TPZFMatrix<double> *)TPZVec<double>::operator[](local_200,0);
  dVar3 = sin((double)(pTVar5->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable);
  dVar3 = (double)B * dVar3;
  pdVar1 = TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffd50->super_TPZFMatrix<double>,in_stack_fffffffffffffd48
                      ,in_stack_fffffffffffffd40);
  *pdVar1 = dVar3;
  pdVar2 = TPZVec<double>::operator[](local_200,1);
  opt = (int)((ulong)pdVar1 >> 0x20);
  dVar3 = cos(*pdVar2);
  pdVar1 = TPZVec<double>::operator[](local_200,0);
  dVar4 = cos(*pdVar1);
  row = (_func_int **)(dVar3 * (dVar4 + 3.0));
  this_01 = (TPZFMatrix<double> *)
            TPZFMatrix<double>::operator()
                      (&in_stack_fffffffffffffd50->super_TPZFMatrix<double>,(int64_t)row,
                       in_stack_fffffffffffffd40);
  (this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = row;
  pdVar1 = TPZVec<double>::operator[](local_200,0);
  this_02 = (TPZManVector<double,_3> *)cos(*pdVar1);
  pdVar2 = TPZFMatrix<double>::operator()(this_01,(int64_t)row,(int64_t)pdVar1);
  *pdVar2 = (double)this_02;
  pdVar1 = TPZFMatrix<double>::operator()(this_01,(int64_t)row,(int64_t)pdVar1);
  *pdVar1 = 0.0;
  TPZMatrix<double>::Multiply(this_00,pTVar5,B,opt);
  TPZManVector<double,_3>::~TPZManVector(this_02);
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x172a601);
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x172a60e);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            TPZFNMatrix<6,T> DxDphi(3,2,0.), gradphi(2,2);
            TPZManVector<T,3> ft(3,0.);
            TPZGeoTriangle::X(fPhiTheta,par,ft);
            TPZGeoTriangle::GradX(fPhiTheta, par, gradphi);
            
            DxDphi(0,0) = -cos(ft[1]) * sin(ft[0]);
            DxDphi(0,1) = -(3. + cos(ft[0])) * sin(ft[1]);
            DxDphi(1,0) = -sin(ft[1]) * sin(ft[0]);
            DxDphi(1,1) = cos(ft[1]) * (3. + cos(ft[0]));
            DxDphi(2,0) = cos(ft[0]);
            DxDphi(2,1) = 0.;
            DxDphi.Multiply(gradphi, gradx);

            
        }